

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
__thiscall
duckdb::StructBoundCastData::InitStructCastLocalState
          (StructBoundCastData *this,CastLocalStateParameters *parameters)

{
  BoundCastData *pBVar1;
  _func_int **pp_Var2;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var4;
  pointer pSVar5;
  _func_int **pp_Var6;
  unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
  child_state;
  templated_unique_single_t result;
  CastLocalStateParameters child_params;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> local_60;
  _Head_base<0UL,_duckdb::StructCastLocalState_*,_false> local_58;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> local_50;
  __uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
  local_48;
  ClientContext *local_40;
  _func_int *local_38;
  
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
  .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>)
       (tuple<duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>)this;
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  pBVar1 = (parameters->cast_data).ptr;
  local_58._M_head_impl = (StructCastLocalState *)operator_new(0x20);
  ((local_58._M_head_impl)->super_FunctionLocalState)._vptr_FunctionLocalState = (_func_int **)0x0;
  ((local_58._M_head_impl)->local_states).
  super_vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_58._M_head_impl)->local_states).
  super_vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_58._M_head_impl)->local_states).
  super_vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_58._M_head_impl)->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__StructCastLocalState_019b2628;
  ((local_58._M_head_impl)->local_states).
  super_vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_58._M_head_impl)->local_states).
  super_vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_58._M_head_impl)->local_states).
  super_vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pp_Var6 = pBVar1[1]._vptr_BoundCastData;
  pp_Var2 = pBVar1[2]._vptr_BoundCastData;
  if (pp_Var6 != pp_Var2) {
    do {
      local_60._M_head_impl = (FunctionLocalState *)0x0;
      if (pp_Var6[1] != (_func_int *)0x0) {
        local_38 = pp_Var6[2];
        local_40 = (parameters->context).ptr;
        (*pp_Var6[1])(&local_50,&local_40);
        _Var4._M_head_impl = local_50._M_head_impl;
        _Var3._M_head_impl = local_60._M_head_impl;
        local_50._M_head_impl = (FunctionLocalState *)0x0;
        local_60._M_head_impl = _Var4._M_head_impl;
        if (_Var3._M_head_impl != (FunctionLocalState *)0x0) {
          (*(_Var3._M_head_impl)->_vptr_FunctionLocalState[1])();
        }
        if (local_50._M_head_impl != (FunctionLocalState *)0x0) {
          (*(local_50._M_head_impl)->_vptr_FunctionLocalState[1])();
        }
      }
      pSVar5 = unique_ptr<duckdb::StructCastLocalState,_std::default_delete<duckdb::StructCastLocalState>,_true>
               ::operator->((unique_ptr<duckdb::StructCastLocalState,_std::default_delete<duckdb::StructCastLocalState>,_true>
                             *)&local_58);
      ::std::
      vector<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>>>
                  *)&pSVar5->local_states,
                 (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
                  *)&local_60);
      if (local_60._M_head_impl != (FunctionLocalState *)0x0) {
        (*(local_60._M_head_impl)->_vptr_FunctionLocalState[1])();
      }
      pp_Var6 = pp_Var6 + 3;
    } while (pp_Var6 != pp_Var2);
  }
  *(StructCastLocalState **)
   local_48._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
   .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl = local_58._M_head_impl;
  return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
          )local_48._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
           .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionLocalState> StructBoundCastData::InitStructCastLocalState(CastLocalStateParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	auto result = make_uniq<StructCastLocalState>();

	for (auto &entry : cast_data.child_cast_info) {
		unique_ptr<FunctionLocalState> child_state;
		if (entry.init_local_state) {
			CastLocalStateParameters child_params(parameters, entry.cast_data);
			child_state = entry.init_local_state(child_params);
		}
		result->local_states.push_back(std::move(child_state));
	}
	return std::move(result);
}